

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.c
# Opt level: O0

int yaml_emitter_check_simple_key(yaml_emitter_t *emitter)

{
  int iVar1;
  ulong local_28;
  size_t length;
  yaml_event_t *event;
  yaml_emitter_t *emitter_local;
  
  switch(((emitter->events).head)->type) {
  case YAML_ALIAS_EVENT:
    local_28 = (emitter->anchor_data).anchor_length;
    break;
  case YAML_SCALAR_EVENT:
    if ((emitter->scalar_data).multiline != 0) {
      return 0;
    }
    local_28 = (emitter->anchor_data).anchor_length + (emitter->tag_data).handle_length +
               (emitter->tag_data).suffix_length + (emitter->scalar_data).length;
    break;
  case YAML_SEQUENCE_START_EVENT:
    iVar1 = yaml_emitter_check_empty_sequence(emitter);
    if (iVar1 == 0) {
      return 0;
    }
    local_28 = (emitter->anchor_data).anchor_length + (emitter->tag_data).handle_length +
               (emitter->tag_data).suffix_length;
    break;
  default:
    return 0;
  case YAML_MAPPING_START_EVENT:
    iVar1 = yaml_emitter_check_empty_mapping(emitter);
    if (iVar1 == 0) {
      return 0;
    }
    local_28 = (emitter->anchor_data).anchor_length + (emitter->tag_data).handle_length +
               (emitter->tag_data).suffix_length;
  }
  emitter_local._4_4_ = (uint)(local_28 < 0x81);
  return emitter_local._4_4_;
}

Assistant:

static int
yaml_emitter_check_simple_key(yaml_emitter_t *emitter)
{
    yaml_event_t *event = emitter->events.head;
    size_t length = 0;

    switch (event->type)
    {
        case YAML_ALIAS_EVENT:
            length += emitter->anchor_data.anchor_length;
            break;

        case YAML_SCALAR_EVENT:
            if (emitter->scalar_data.multiline)
                return 0;
            length += emitter->anchor_data.anchor_length
                + emitter->tag_data.handle_length
                + emitter->tag_data.suffix_length
                + emitter->scalar_data.length;
            break;

        case YAML_SEQUENCE_START_EVENT:
            if (!yaml_emitter_check_empty_sequence(emitter))
                return 0;
            length += emitter->anchor_data.anchor_length
                + emitter->tag_data.handle_length
                + emitter->tag_data.suffix_length;
            break;

        case YAML_MAPPING_START_EVENT:
            if (!yaml_emitter_check_empty_mapping(emitter))
                return 0;
            length += emitter->anchor_data.anchor_length
                + emitter->tag_data.handle_length
                + emitter->tag_data.suffix_length;
            break;

        default:
            return 0;
    }

    if (length > 128)
        return 0;

    return 1;
}